

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousehandler.cpp
# Opt level: O2

void __thiscall QEvdevMouseHandler::readMouseData(QEvdevMouseHandler *this)

{
  short sVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  QPoint _t1;
  int iVar11;
  bool bVar12;
  long lVar13;
  long in_FS_OFFSET;
  undefined4 uStack_370;
  char local_358 [24];
  char *local_340;
  input_event buffer [32];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  memset(buffer,0xaa,0x300);
  uVar10 = 0;
LAB_0012707d:
  do {
    iVar4 = *(int *)(this + 0x28);
    do {
      sVar5 = read(iVar4,(void *)((long)&buffer[0].time.tv_sec + uVar10),0x300 - uVar10);
      if (sVar5 != -1) {
        iVar4 = (int)sVar5;
        if (iVar4 == 0) {
          local_358[0] = '\x02';
          local_358[1] = '\0';
          local_358[2] = '\0';
          local_358[3] = '\0';
          local_358[0x14] = '\0';
          local_358[0x15] = '\0';
          local_358[0x16] = '\0';
          local_358[0x17] = '\0';
          local_358[4] = '\0';
          local_358[5] = '\0';
          local_358[6] = '\0';
          local_358[7] = '\0';
          local_358[8] = '\0';
          local_358[9] = '\0';
          local_358[10] = '\0';
          local_358[0xb] = '\0';
          local_358[0xc] = '\0';
          local_358[0xd] = '\0';
          local_358[0xe] = '\0';
          local_358[0xf] = '\0';
          local_358[0x10] = '\0';
          local_358[0x11] = '\0';
          local_358[0x12] = '\0';
          local_358[0x13] = '\0';
          local_340 = "default";
          QMessageLogger::warning(local_358,"evdevmouse: Got EOF from the input device");
          goto LAB_00127368;
        }
        if (-1 < iVar4) {
          uVar9 = (int)uVar10 + iVar4;
          uVar10 = (ulong)uVar9;
          if (uVar9 % 0x18 != 0) goto LAB_0012707d;
          lVar13 = 0;
          bVar3 = 0;
          bVar12 = false;
          bVar8 = false;
          goto LAB_00127108;
        }
        piVar6 = __errno_location();
        iVar11 = *piVar6;
        break;
      }
      piVar6 = __errno_location();
      iVar11 = *piVar6;
    } while (iVar11 == 4);
  } while ((iVar11 == 4) || (iVar11 == 0xb));
  qErrnoWarning(iVar11,"evdevmouse: Could not read from input device");
  if (*piVar6 == 0x13) {
    if (*(long **)(this + 0x30) != (long *)0x0) {
      (**(code **)(**(long **)(this + 0x30) + 0x20))();
    }
    *(undefined8 *)(this + 0x30) = 0;
    qt_safe_close(*(int *)(this + 0x28));
    *(undefined4 *)(this + 0x28) = 0xffffffff;
  }
LAB_00127368:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_0012738d:
  __stack_chk_fail();
LAB_00127108:
  if ((uVar10 / 0x18) * 0x18 - lVar13 == 0) goto LAB_0012731a;
  switch(*(undefined2 *)((long)&buffer[0].type + lVar13)) {
  case 0:
    if (*(short *)((long)&buffer[0].code + lVar13) == 0) {
      if (bVar12) {
        sendMouseEvent(this);
        bVar3 = 0;
      }
      else if (bVar8) {
        *(undefined4 *)(this + 0x54) = 5;
        if (this[0x49] == (QEvdevMouseHandler)0x0) {
          sendMouseEvent(this);
        }
        else {
          bVar3 = 1;
        }
      }
      bVar12 = false;
      bVar8 = false;
    }
    break;
  case 1:
    sVar1 = *(short *)((long)&buffer[0].code + lVar13);
    if (sVar1 == 0x14a) {
      this[0x5c] = (QEvdevMouseHandler)0x1;
    }
    else if ((ushort)(sVar1 - 0x110U) < 0x11) {
      uVar9 = 0;
      if ((ushort)(sVar1 - 0x110U) < 0x10) {
        uVar9 = *(uint *)(&DAT_001366b0 + (ulong)(ushort)(sVar1 - 0x110U) * 4);
      }
      if (*(int *)((long)&buffer[0].value + lVar13) == 0) {
        uVar7 = ~uVar9 & *(uint *)(this + 0x4c);
        uStack_370 = 3;
      }
      else {
        uVar7 = *(uint *)(this + 0x4c) | uVar9;
        uStack_370 = 2;
      }
      *(uint *)(this + 0x4c) = uVar7;
      *(uint *)(this + 0x50) = uVar9;
      *(undefined4 *)(this + 0x54) = uStack_370;
      bVar12 = true;
    }
    break;
  case 2:
    sVar1 = *(short *)((long)&buffer[0].code + lVar13);
    if (sVar1 == 1) {
      *(int *)(this + 0x3c) = *(int *)(this + 0x3c) + *(int *)((long)&buffer[0].value + lVar13);
    }
    else {
      if (sVar1 != 0) {
        if ((sVar1 == 8) && (this[0x4a] == (QEvdevMouseHandler)0x0)) {
          uVar9 = *(int *)((long)&buffer[0].value + lVar13) * 0x78;
LAB_00127250:
          _t1 = (QPoint)((ulong)uVar9 << 0x20);
        }
        else {
          if (sVar1 == 0xb) {
            uVar9 = *(uint *)((long)&buffer[0].value + lVar13);
            goto LAB_00127250;
          }
          if ((sVar1 == 6) && (this[0x4b] == (QEvdevMouseHandler)0x0)) {
            _t1.xp.m_i = *(int *)((long)&buffer[0].value + lVar13) * -0x78;
            _t1.yp.m_i = 0;
          }
          else {
            if (sVar1 != 0xc) break;
            _t1.yp.m_i = 0;
            _t1.xp.m_i = -*(int *)((long)&buffer[0].value + lVar13);
          }
        }
        handleWheelEvent(this,_t1);
        break;
      }
      *(int *)(this + 0x38) = *(int *)(this + 0x38) + *(int *)((long)&buffer[0].value + lVar13);
    }
LAB_0012720e:
    bVar8 = true;
    break;
  case 3:
    sVar1 = *(short *)((long)&buffer[0].code + lVar13);
    if (sVar1 == 1) {
      iVar4 = *(int *)((long)&buffer[0].value + lVar13);
      if (*(int *)(this + 0x3c) != iVar4) {
        *(int *)(this + 0x3c) = iVar4;
        goto LAB_0012720e;
      }
    }
    else if ((sVar1 == 0) &&
            (iVar4 = *(int *)((long)&buffer[0].value + lVar13), *(int *)(this + 0x38) != iVar4)) {
      *(int *)(this + 0x38) = iVar4;
      goto LAB_0012720e;
    }
  }
  lVar13 = lVar13 + 0x18;
  goto LAB_00127108;
LAB_0012731a:
  if ((((byte)this[0x49] & bVar3) != 0) &&
     (*(int *)(this + 0x58) <
      (*(int *)(this + 0x3c) - *(int *)(this + 0x44)) *
      (*(int *)(this + 0x3c) - *(int *)(this + 0x44)) +
      (*(int *)(this + 0x38) - *(int *)(this + 0x40)) *
      (*(int *)(this + 0x38) - *(int *)(this + 0x40)))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      sendMouseEvent(this);
      return;
    }
    goto LAB_0012738d;
  }
  goto LAB_00127368;
}

Assistant:

void QEvdevMouseHandler::readMouseData()
{
    struct ::input_event buffer[32];
    int n = 0;
    bool posChanged = false, btnChanged = false;
    bool pendingMouseEvent = false;
    forever {
        int result = QT_READ(m_fd, reinterpret_cast<char *>(buffer) + n, sizeof(buffer) - n);

        if (result == 0) {
            qWarning("evdevmouse: Got EOF from the input device");
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning(errno, "evdevmouse: Could not read from input device");
                // If the device got disconnected, stop reading, otherwise we get flooded
                // by the above error over and over again.
                if (errno == ENODEV) {
                    delete m_notify;
                    m_notify = nullptr;
                    qt_safe_close(m_fd);
                    m_fd = -1;
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(buffer[0]) == 0)
                break;
        }
    }